

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiheadattention_x86.cpp
# Opt level: O3

int __thiscall
ncnn::MultiHeadAttention_x86::forward
          (MultiHeadAttention_x86 *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *_opt)

{
  undefined8 *puVar1;
  int iVar2;
  int iVar3;
  pointer pMVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  size_t sVar7;
  Allocator *pAVar8;
  int iVar9;
  void *pvVar10;
  Allocator *pAVar11;
  long lVar12;
  undefined4 uVar13;
  long *plVar14;
  undefined4 uVar15;
  int iVar16;
  int _w;
  int iVar17;
  long lVar18;
  pointer pMVar19;
  void *pvVar20;
  long *plVar21;
  void *pvVar22;
  long lVar23;
  int *piVar24;
  long lVar25;
  long lVar26;
  Option opt1;
  Option opt;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> qk_bottom_blobs;
  vector<int,_std::allocator<int>_> retqkvs;
  vector<int,_std::allocator<int>_> retqks;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> qkv_bottom_blobs;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> qk_top_blobs;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> qkv_top_blobs;
  long local_380;
  long local_378;
  value_type local_368;
  long local_320;
  Mat local_318;
  MultiHeadAttention_x86 *local_2c8;
  int *local_2c0;
  Mat local_2b8;
  Option local_268;
  Mat local_228;
  vector<int,_std::allocator<int>_> local_1d8;
  vector<int,_std::allocator<int>_> local_1b8;
  Mat local_198;
  long local_150;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_148;
  pointer local_140;
  void *local_138;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  undefined4 local_128;
  undefined4 uStack_124;
  undefined4 local_120;
  long *local_118;
  undefined4 uStack_110;
  int iStack_10c;
  undefined4 uStack_108;
  undefined4 uStack_104;
  undefined4 local_100;
  undefined8 local_f8;
  void *local_e8;
  undefined4 uStack_e0;
  undefined4 uStack_dc;
  undefined4 local_d8;
  undefined4 uStack_d4;
  undefined4 local_d0;
  long *local_c8;
  undefined4 uStack_c0;
  int iStack_bc;
  undefined4 uStack_b8;
  undefined4 uStack_b4;
  undefined4 local_b0;
  undefined8 local_a8;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> local_a0;
  Option local_88;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> local_48;
  
  pMVar4 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar18 = (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_finish - (long)pMVar4;
  pMVar19 = pMVar4;
  local_140 = pMVar4;
  if (lVar18 == 0x48) {
    iVar17 = (this->super_MultiHeadAttention).attn_mask;
LAB_0051c391:
    if (iVar17 != 0) goto LAB_0051c3da;
    local_2b8.cstep = 0;
    local_2b8.data = (void *)0x0;
    local_2b8.refcount._0_4_ = 0;
    local_2b8.refcount._4_4_ = 0;
    local_2b8.elemsize._0_4_ = 0;
    local_2b8.elemsize._4_4_ = 0;
    local_2b8.elempack = 0;
    local_2b8.allocator = (Allocator *)0x0;
    local_2b8.dims = 0;
    local_2b8.w = 0;
    local_2b8.h = 0;
    local_2b8.d = 0;
    local_2b8.c = 0;
  }
  else {
    iVar17 = (this->super_MultiHeadAttention).attn_mask;
    if (iVar17 == 0 || lVar18 != 0x90) {
      pMVar19 = pMVar4 + 1;
      local_140 = pMVar19;
      if (iVar17 == 0) {
        local_140 = pMVar4 + 2;
      }
      if (lVar18 != 0xd8) {
        local_140 = pMVar4 + 2;
      }
      if (lVar18 == 0x90) {
        local_140 = pMVar19;
      }
      goto LAB_0051c391;
    }
LAB_0051c3da:
    local_2b8.data = *(void **)((long)pMVar4 + lVar18 + -0x48);
    piVar24 = *(int **)((long)pMVar4 + lVar18 + -0x40);
    local_2b8.refcount._0_4_ = SUB84(piVar24,0);
    local_2b8.refcount._4_4_ = (undefined4)((ulong)piVar24 >> 0x20);
    uVar5 = *(undefined8 *)((long)pMVar4 + lVar18 + -0x38);
    local_2b8.elemsize._0_4_ = (undefined4)uVar5;
    local_2b8.elemsize._4_4_ = (undefined4)((ulong)uVar5 >> 0x20);
    local_2b8.elempack = *(int *)((long)pMVar4 + lVar18 + -0x30);
    local_2b8.allocator = *(Allocator **)((long)pMVar4 + lVar18 + -0x28);
    puVar1 = (undefined8 *)((long)pMVar4 + lVar18 + -0x20);
    uVar5 = *puVar1;
    uVar6 = puVar1[1];
    local_2b8.dims = (int)uVar5;
    local_2b8.w = (int)((ulong)uVar5 >> 0x20);
    local_2b8.h = (int)uVar6;
    local_2b8.d = (int)((ulong)uVar6 >> 0x20);
    local_2b8.c = *(int *)((long)pMVar4 + lVar18 + -0x10);
    local_2b8.cstep = *(ulong *)((long)pMVar4 + lVar18 + -8);
    if (piVar24 != (int *)0x0) {
      LOCK();
      *piVar24 = *piVar24 + 1;
      UNLOCK();
    }
  }
  local_2c0 = &(this->super_MultiHeadAttention).attn_mask;
  local_268.lightmode = _opt->lightmode;
  local_268.use_shader_pack8 = _opt->use_shader_pack8;
  local_268.use_subgroup_ops = _opt->use_subgroup_ops;
  local_268.use_reserved_0 = _opt->use_reserved_0;
  local_268.num_threads = _opt->num_threads;
  local_268.blob_allocator = _opt->blob_allocator;
  local_268.workspace_allocator._0_4_ = *(undefined4 *)&_opt->workspace_allocator;
  local_268.workspace_allocator._4_4_ = *(undefined4 *)((long)&_opt->workspace_allocator + 4);
  local_268.openmp_blocktime = _opt->openmp_blocktime;
  local_268.use_winograd_convolution = _opt->use_winograd_convolution;
  local_268.use_sgemm_convolution = _opt->use_sgemm_convolution;
  local_268.use_int8_inference = _opt->use_int8_inference;
  local_268.use_vulkan_compute = _opt->use_vulkan_compute;
  local_268.use_bf16_storage = _opt->use_bf16_storage;
  local_268.use_fp16_packed = _opt->use_fp16_packed;
  local_268.use_fp16_storage = _opt->use_fp16_storage;
  local_268.use_fp16_arithmetic = _opt->use_fp16_arithmetic;
  local_268.use_int8_packed = _opt->use_int8_packed;
  local_268.use_int8_storage = _opt->use_int8_storage;
  local_268.use_int8_arithmetic = _opt->use_int8_arithmetic;
  local_268.use_packing_layout = _opt->use_packing_layout;
  local_268.vulkan_device_index = _opt->vulkan_device_index;
  local_268.use_reserved_1 = _opt->use_reserved_1;
  local_268.use_image_storage = _opt->use_image_storage;
  local_268.use_tensor_storage = _opt->use_tensor_storage;
  local_268.use_reserved_2 = _opt->use_reserved_2;
  local_268.flush_denormals = _opt->flush_denormals;
  local_268.use_local_pool_allocator = _opt->use_local_pool_allocator;
  local_268.use_shader_local_memory = _opt->use_shader_local_memory;
  local_268.use_cooperative_matrix = _opt->use_cooperative_matrix;
  local_268.use_winograd23_convolution = _opt->use_winograd23_convolution;
  local_268.use_winograd43_convolution = _opt->use_winograd43_convolution;
  local_268.use_winograd63_convolution = _opt->use_winograd63_convolution;
  local_268.use_a53_a55_optimized_kernel = _opt->use_a53_a55_optimized_kernel;
  local_268.use_fp16_uniform = _opt->use_fp16_uniform;
  local_268.use_int8_uniform = _opt->use_int8_uniform;
  local_268.use_reserved_9 = _opt->use_reserved_9;
  local_268.use_reserved_10 = _opt->use_reserved_10;
  local_268.use_reserved_11 = _opt->use_reserved_11;
  if ((this->super_MultiHeadAttention).int8_scale_term != 0) {
    local_268._36_4_ = local_268._36_4_ & 0xffffff;
  }
  local_318.cstep = 0;
  local_318.data = (void *)0x0;
  local_318.refcount._0_4_ = 0;
  local_318.refcount._4_4_ = 0;
  local_318.elemsize._0_4_ = 0;
  local_318.elemsize._4_4_ = 0;
  local_318.elempack = 0;
  local_318.allocator = (Allocator *)0x0;
  local_318.dims = 0;
  local_318.w = 0;
  local_318.h = 0;
  local_318.d = 0;
  local_318.c = 0;
  local_148 = top_blobs;
  if ((*local_2c0 == 0) || (local_2b8.elempack == 1)) {
    piVar24 = (int *)CONCAT44(local_2b8.refcount._4_4_,local_2b8.refcount._0_4_);
    if (piVar24 != (int *)0x0) {
      LOCK();
      *piVar24 = *piVar24 + 1;
      UNLOCK();
    }
    local_318.data = local_2b8.data;
    local_318.refcount._0_4_ = local_2b8.refcount._0_4_;
    local_318.refcount._4_4_ = local_2b8.refcount._4_4_;
    local_318.elemsize._0_4_ = (undefined4)local_2b8.elemsize;
    local_318.elemsize._4_4_ = local_2b8.elemsize._4_4_;
    local_318.elempack = local_2b8.elempack;
    local_318.allocator = local_2b8.allocator;
    local_318.dims = local_2b8.dims;
    local_318.w = local_2b8.w;
    local_318.h = local_2b8.h;
    local_318.d = local_2b8.d;
    local_318.c = local_2b8.c;
    local_318.cstep = local_2b8.cstep;
  }
  else {
    convert_packing(&local_2b8,&local_318,1,&local_268);
    iVar17 = -100;
    if ((local_318.data == (void *)0x0) || ((long)local_318.c * local_318.cstep == 0))
    goto LAB_0051ccbc;
  }
  iVar16 = (this->super_MultiHeadAttention).embed_dim / (this->super_MultiHeadAttention).num_heads;
  _w = pMVar4->elempack * pMVar4->h;
  iVar2 = pMVar19->elempack;
  iVar3 = pMVar19->h;
  local_a8 = 0;
  local_e8 = (void *)0x0;
  uStack_e0 = 0;
  uStack_dc = 0;
  local_d8 = 0;
  uStack_d4 = 0;
  local_d0 = 0;
  local_c8 = (long *)0x0;
  uStack_c0 = 0;
  iStack_bc = 0;
  uStack_b8 = 0;
  uStack_b4 = 0;
  local_b0 = 0;
  iVar17 = (*this->q_gemm->_vptr_Layer[7])(this->q_gemm,pMVar4,&local_e8,&local_268);
  if (iVar17 == 0) {
    local_f8 = 0;
    local_138 = (void *)0x0;
    uStack_130 = 0;
    uStack_12c = 0;
    local_128 = 0;
    uStack_124 = 0;
    local_120 = 0;
    local_118 = (long *)0x0;
    uStack_110 = 0;
    iStack_10c = 0;
    uStack_108 = 0;
    uStack_104 = 0;
    local_100 = 0;
    iVar17 = (*this->k_gemm->_vptr_Layer[7])(this->k_gemm,pMVar19,&local_138,&local_268);
    if (iVar17 == 0) {
      local_198.cstep = 0;
      local_198.data = (void *)0x0;
      local_198.refcount._0_4_ = 0;
      local_198.refcount._4_4_ = 0;
      local_198.elemsize._0_4_ = 0;
      local_198.elemsize._4_4_ = 0;
      local_198.elempack = 0;
      local_198.allocator = (Allocator *)0x0;
      local_198.dims = 0;
      local_198.w = 0;
      local_198.h = 0;
      local_198.d = 0;
      local_198.c = 0;
      Mat::create(&local_198,iVar2 * iVar3,(this->super_MultiHeadAttention).num_heads * _w,4,
                  local_268.blob_allocator);
      iVar17 = -100;
      if ((local_198.data != (void *)0x0) && ((long)local_198.c * local_198.cstep != 0)) {
        local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        std::vector<int,_std::allocator<int>_>::resize
                  (&local_1b8,(long)(this->super_MultiHeadAttention).num_heads);
        if (0 < (this->super_MultiHeadAttention).num_heads) {
          lVar18 = (long)iVar16;
          local_150 = (long)_w;
          lVar23 = 0;
          local_320 = 0;
          local_378 = 0;
          local_2c8 = this;
          do {
            std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
                      ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&local_228,2,
                       (allocator_type *)&local_368);
            iVar17 = iStack_bc;
            plVar21 = local_c8;
            uVar15 = local_d0;
            pvVar20 = local_228.data;
            lVar25 = (long)iStack_bc;
            lVar26 = CONCAT44(uStack_d4,local_d8);
            pvVar22 = (void *)(lVar23 * lVar25 * lVar26 + (long)local_e8);
            piVar24 = *(int **)((long)local_228.data + 8);
            if (piVar24 != (int *)0x0) {
              LOCK();
              *piVar24 = *piVar24 + -1;
              UNLOCK();
              if (*piVar24 == 0) {
                if (*(long **)((long)local_228.data + 0x20) == (long *)0x0) {
                  if (*local_228.data != (void *)0x0) {
                    free(*local_228.data);
                  }
                }
                else {
                  (**(code **)(**(long **)((long)local_228.data + 0x20) + 0x18))();
                }
              }
            }
            iVar2 = iStack_10c;
            plVar14 = local_118;
            uVar13 = local_120;
            pvVar10 = local_228.data;
            *(void **)pvVar20 = pvVar22;
            *(long *)((long)pvVar20 + 8) = 0;
            *(long *)((long)pvVar20 + 0x10) = lVar26;
            *(undefined4 *)((long)pvVar20 + 0x18) = uVar15;
            *(long **)((long)pvVar20 + 0x20) = plVar21;
            *(undefined4 *)((long)pvVar20 + 0x28) = 2;
            *(int *)((long)pvVar20 + 0x2c) = iVar17;
            *(int *)((long)pvVar20 + 0x30) = iVar16;
            *(undefined8 *)((long)pvVar20 + 0x34) = 0x100000001;
            *(long *)((long)pvVar20 + 0x40) = lVar25 * lVar18;
            lVar25 = (long)iStack_10c;
            lVar26 = CONCAT44(uStack_124,local_128);
            piVar24 = *(int **)((long)local_228.data + 0x50);
            pvVar20 = (void *)(lVar23 * lVar25 * lVar26 + (long)local_138);
            if (piVar24 != (int *)0x0) {
              LOCK();
              *piVar24 = *piVar24 + -1;
              UNLOCK();
              if (*piVar24 == 0) {
                if (*(long **)((long)local_228.data + 0x68) == (long *)0x0) {
                  if (*(void **)((long)local_228.data + 0x48) != (void *)0x0) {
                    free(*(void **)((long)local_228.data + 0x48));
                  }
                }
                else {
                  (**(code **)(**(long **)((long)local_228.data + 0x68) + 0x18))();
                }
              }
            }
            *(void **)((long)pvVar10 + 0x48) = pvVar20;
            *(long *)((long)pvVar10 + 0x50) = 0;
            *(long *)((long)pvVar10 + 0x58) = lVar26;
            *(undefined4 *)((long)pvVar10 + 0x60) = uVar13;
            *(long **)((long)pvVar10 + 0x68) = plVar14;
            *(undefined4 *)((long)pvVar10 + 0x70) = 2;
            *(int *)((long)pvVar10 + 0x74) = iVar2;
            *(int *)((long)pvVar10 + 0x78) = iVar16;
            *(undefined8 *)((long)pvVar10 + 0x7c) = 0x100000001;
            *(long *)((long)pvVar10 + 0x88) = lVar25 * lVar18;
            if (*local_2c0 != 0) {
              if (local_318.dims == 3) {
                local_368.cstep = CONCAT44(local_318.elemsize._4_4_,(undefined4)local_318.elemsize);
                local_368.data =
                     (void *)(local_318.cstep * local_378 * local_368.cstep + (long)local_318.data);
                local_368.refcount._0_4_ = 0;
                local_368.refcount._4_4_ = 0;
                local_368.d = 1;
                local_368.c = local_318.d;
                local_368.cstep =
                     ((long)local_318.h * (long)local_318.w * local_368.cstep + 0xf &
                     0xfffffffffffffff0) / local_368.cstep;
                local_368.dims = 2;
              }
              else {
                piVar24 = (int *)CONCAT44(local_318.refcount._4_4_,local_318.refcount._0_4_);
                local_368.data = local_318.data;
                local_368.refcount._0_4_ = local_318.refcount._0_4_;
                local_368.refcount._4_4_ = local_318.refcount._4_4_;
                local_368.dims = local_318.dims;
                local_368.d = local_318.d;
                local_368.c = local_318.c;
                local_368.cstep = local_318.cstep;
                if (piVar24 != (int *)0x0) {
                  LOCK();
                  *piVar24 = *piVar24 + 1;
                  UNLOCK();
                }
              }
              local_368.h = local_318.h;
              local_368.w = local_318.w;
              local_368.allocator = local_318.allocator;
              local_368.elempack = local_318.elempack;
              local_368.elemsize._4_4_ = local_318.elemsize._4_4_;
              local_368.elemsize._0_4_ = (undefined4)local_318.elemsize;
              std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::push_back
                        ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&local_228,&local_368);
              piVar24 = (int *)CONCAT44(local_368.refcount._4_4_,local_368.refcount._0_4_);
              if (piVar24 != (int *)0x0) {
                LOCK();
                *piVar24 = *piVar24 + -1;
                UNLOCK();
                if (*piVar24 == 0) {
                  if (local_368.allocator == (Allocator *)0x0) {
                    if (local_368.data != (void *)0x0) {
                      free(local_368.data);
                    }
                  }
                  else {
                    (*(local_368.allocator)->_vptr_Allocator[3])();
                  }
                }
              }
            }
            std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
                      ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&local_88,1,
                       (allocator_type *)&local_368);
            iVar2 = local_198.w;
            pAVar11 = local_198.allocator;
            iVar17 = local_198.elempack;
            lVar25 = (long)local_198.w;
            lVar26 = CONCAT44(local_198.elemsize._4_4_,(undefined4)local_198.elemsize);
            pvVar20 = (void *)(local_320 * lVar25 * lVar26 + (long)local_198.data);
            plVar21 = (long *)CONCAT44(local_88.num_threads,local_88._0_4_);
            piVar24 = (int *)plVar21[1];
            if (piVar24 != (int *)0x0) {
              LOCK();
              *piVar24 = *piVar24 + -1;
              UNLOCK();
              if (*piVar24 == 0) {
                if ((long *)plVar21[4] == (long *)0x0) {
                  if ((void *)*plVar21 != (void *)0x0) {
                    free((void *)*plVar21);
                  }
                }
                else {
                  (**(code **)(*(long *)plVar21[4] + 0x18))();
                }
              }
            }
            lVar12 = local_150;
            this = local_2c8;
            *plVar21 = (long)pvVar20;
            plVar21[1] = 0;
            plVar21[2] = lVar26;
            *(int *)(plVar21 + 3) = iVar17;
            plVar21[4] = (long)pAVar11;
            *(undefined4 *)(plVar21 + 5) = 2;
            *(int *)((long)plVar21 + 0x2c) = iVar2;
            *(int *)(plVar21 + 6) = _w;
            *(undefined8 *)((long)plVar21 + 0x34) = 0x100000001;
            plVar21[8] = lVar25 * local_150;
            local_368.refcount._0_4_ = local_268.blob_allocator._0_4_;
            local_368.refcount._4_4_ = local_268.blob_allocator._4_4_;
            local_368.h = local_268.flush_denormals;
            local_368.d._0_1_ = local_268.use_local_pool_allocator;
            local_368.d._1_1_ = local_268.use_shader_local_memory;
            local_368.d._2_1_ = local_268.use_cooperative_matrix;
            local_368.d._3_1_ = local_268.use_winograd23_convolution;
            local_368.c._0_1_ = local_268.use_winograd43_convolution;
            local_368.c._1_1_ = local_268.use_winograd63_convolution;
            local_368.c._2_1_ = local_268.use_a53_a55_optimized_kernel;
            local_368.c._3_1_ = local_268.use_fp16_uniform;
            local_368._60_1_ = local_268.use_int8_uniform;
            local_368._61_1_ = local_268.use_reserved_9;
            local_368._62_1_ = local_268.use_reserved_10;
            local_368._63_1_ = local_268.use_reserved_11;
            local_368.allocator = (Allocator *)CONCAT44(local_268._36_4_,local_268._32_4_);
            local_368.dims = local_268.vulkan_device_index;
            local_368.w._0_1_ = local_268.use_reserved_1;
            local_368.w._1_1_ = local_268.use_image_storage;
            local_368.w._2_1_ = local_268.use_tensor_storage;
            local_368.w._3_1_ = local_268.use_reserved_2;
            local_368.elemsize._0_4_ = local_268.workspace_allocator._0_4_;
            local_368.elemsize._4_4_ = local_268.workspace_allocator._4_4_;
            local_368.elempack = local_268.openmp_blocktime;
            local_368._28_1_ = local_268.use_winograd_convolution;
            local_368._29_1_ = local_268.use_sgemm_convolution;
            local_368._30_1_ = local_268.use_int8_inference;
            local_368._31_1_ = local_268.use_vulkan_compute;
            local_368.data = (void *)CONCAT44(1,local_268._0_4_);
            iVar17 = (*local_2c8->qk_gemm->_vptr_Layer[6])
                               (local_2c8->qk_gemm,&local_228,&local_88,&local_368);
            local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[local_378] = iVar17;
            std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector
                      ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&local_88);
            std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector
                      ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&local_228);
            local_378 = local_378 + 1;
            iVar2 = (this->super_MultiHeadAttention).num_heads;
            local_320 = local_320 + lVar12;
            lVar23 = lVar23 + lVar18;
          } while (local_378 < iVar2);
          if (0 < iVar2) {
            lVar18 = 0;
            do {
              iVar17 = local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar18];
              if (iVar17 != 0) goto LAB_0051ce20;
              lVar18 = lVar18 + 1;
            } while (iVar2 != lVar18);
          }
        }
        piVar24 = (int *)CONCAT44(uStack_dc,uStack_e0);
        if (piVar24 != (int *)0x0) {
          LOCK();
          *piVar24 = *piVar24 + -1;
          UNLOCK();
          if (*piVar24 == 0) {
            if (local_c8 == (long *)0x0) {
              if (local_e8 != (void *)0x0) {
                free(local_e8);
              }
            }
            else {
              (**(code **)(*local_c8 + 0x18))();
            }
          }
        }
        local_a8 = 0;
        local_e8 = (void *)0x0;
        uStack_e0 = 0;
        uStack_dc = 0;
        local_d8 = 0;
        uStack_d4 = 0;
        local_d0 = 0;
        uStack_c0 = 0;
        iStack_bc = 0;
        uStack_b8 = 0;
        uStack_b4 = 0;
        local_b0 = 0;
        piVar24 = (int *)CONCAT44(uStack_12c,uStack_130);
        if (piVar24 != (int *)0x0) {
          LOCK();
          *piVar24 = *piVar24 + -1;
          UNLOCK();
          if (*piVar24 == 0) {
            if (local_118 == (long *)0x0) {
              if (local_138 != (void *)0x0) {
                free(local_138);
              }
            }
            else {
              (**(code **)(*local_118 + 0x18))();
            }
          }
        }
        local_f8 = 0;
        local_138 = (void *)0x0;
        uStack_130 = 0;
        uStack_12c = 0;
        local_128 = 0;
        uStack_124 = 0;
        local_120 = 0;
        uStack_110 = 0;
        iStack_10c = 0;
        uStack_108 = 0;
        uStack_104 = 0;
        local_100 = 0;
        iVar17 = (*this->qk_softmax->_vptr_Layer[9])(this->qk_softmax,&local_198,&local_268);
        if (iVar17 == 0) {
          local_368.cstep = 0;
          local_368.data = (void *)0x0;
          local_368.refcount._0_4_ = 0;
          local_368.refcount._4_4_ = 0;
          local_368.elemsize._0_4_ = 0;
          local_368.elemsize._4_4_ = 0;
          local_368.elempack = 0;
          local_368.allocator = (Allocator *)0x0;
          local_368.dims = 0;
          local_368.w = 0;
          local_368.h = 0;
          local_368.d = 0;
          local_368.c = 0;
          iVar17 = (*this->v_gemm->_vptr_Layer[7])(this->v_gemm,local_140,&local_368,&local_268);
          if (iVar17 == 0) {
            local_228.cstep = 0;
            local_228.data = (long *)0x0;
            local_228.refcount._0_4_ = 0;
            local_228.refcount._4_4_ = 0;
            local_228.elemsize._0_4_ = 0;
            local_228.elemsize._4_4_ = 0;
            local_228.elempack = 0;
            local_228.allocator = (Allocator *)0x0;
            local_228.dims = 0;
            local_228.w = 0;
            local_228.h = 0;
            local_228.d = 0;
            local_228.c = 0;
            Mat::create(&local_228,_w,(this->super_MultiHeadAttention).num_heads * iVar16,4,
                        local_268.blob_allocator);
            iVar17 = -100;
            if (((long *)local_228.data != (long *)0x0) &&
               ((long)local_228.c * local_228.cstep != 0)) {
              local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              std::vector<int,_std::allocator<int>_>::resize
                        (&local_1d8,(long)(this->super_MultiHeadAttention).num_heads);
              if (0 < (this->super_MultiHeadAttention).num_heads) {
                lVar23 = (long)iVar16;
                lVar18 = 0;
                local_380 = 0;
                piVar24 = (int *)0x0;
                local_2c8 = this;
                do {
                  local_2c0 = piVar24;
                  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
                            (&local_a0,2,(allocator_type *)&local_88);
                  pMVar19 = local_a0.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                            _M_impl.super__Vector_impl_data._M_start;
                  iVar2 = local_198.w;
                  pAVar11 = local_198.allocator;
                  iVar17 = local_198.elempack;
                  lVar26 = (long)local_198.w;
                  sVar7 = CONCAT44(local_198.elemsize._4_4_,(undefined4)local_198.elemsize);
                  pvVar20 = (void *)(lVar18 * lVar26 * sVar7 + (long)local_198.data);
                  piVar24 = (local_a0.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                             _M_impl.super__Vector_impl_data._M_start)->refcount;
                  local_320 = lVar18;
                  if (piVar24 != (int *)0x0) {
                    LOCK();
                    *piVar24 = *piVar24 + -1;
                    UNLOCK();
                    if (*piVar24 == 0) {
                      if ((local_a0.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                           _M_impl.super__Vector_impl_data._M_start)->allocator == (Allocator *)0x0)
                      {
                        if ((local_a0.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                             _M_impl.super__Vector_impl_data._M_start)->data != (void *)0x0) {
                          free((local_a0.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                _M_impl.super__Vector_impl_data._M_start)->data);
                        }
                      }
                      else {
                        (*(local_a0.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                           _M_impl.super__Vector_impl_data._M_start)->allocator->_vptr_Allocator[3])
                                  ();
                      }
                    }
                  }
                  pMVar4 = local_a0.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                           _M_impl.super__Vector_impl_data._M_start;
                  iVar9 = local_368.w;
                  pAVar8 = local_368.allocator;
                  iVar3 = local_368.elempack;
                  pMVar19->data = pvVar20;
                  pMVar19->refcount = (int *)0x0;
                  pMVar19->elemsize = sVar7;
                  pMVar19->elempack = iVar17;
                  pMVar19->allocator = pAVar11;
                  pMVar19->dims = 2;
                  pMVar19->w = iVar2;
                  pMVar19->h = _w;
                  pMVar19->d = 1;
                  pMVar19->c = 1;
                  pMVar19->cstep = lVar26 * _w;
                  lVar18 = (long)local_368.w;
                  sVar7 = CONCAT44(local_368.elemsize._4_4_,(undefined4)local_368.elemsize);
                  piVar24 = local_a0.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                            _M_impl.super__Vector_impl_data._M_start[1].refcount;
                  pvVar20 = (void *)(local_380 * lVar18 * sVar7 + (long)local_368.data);
                  if (piVar24 != (int *)0x0) {
                    LOCK();
                    *piVar24 = *piVar24 + -1;
                    UNLOCK();
                    if (*piVar24 == 0) {
                      if (local_a0.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                          .super__Vector_impl_data._M_start[1].allocator == (Allocator *)0x0) {
                        if (local_a0.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                            _M_impl.super__Vector_impl_data._M_start[1].data != (void *)0x0) {
                          free(local_a0.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                               _M_impl.super__Vector_impl_data._M_start[1].data);
                        }
                      }
                      else {
                        (*(local_a0.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                           _M_impl.super__Vector_impl_data._M_start[1].allocator)->_vptr_Allocator
                          [3])();
                      }
                    }
                  }
                  pMVar4[1].data = pvVar20;
                  pMVar4[1].refcount = (int *)0x0;
                  pMVar4[1].elemsize = sVar7;
                  pMVar4[1].elempack = iVar3;
                  pMVar4[1].allocator = pAVar8;
                  pMVar4[1].dims = 2;
                  pMVar4[1].w = iVar9;
                  pMVar4[1].h = iVar16;
                  pMVar4[1].d = 1;
                  pMVar4[1].c = 1;
                  pMVar4[1].cstep = lVar18 * lVar23;
                  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
                            (&local_48,1,(allocator_type *)&local_88);
                  pMVar19 = local_48.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                            _M_impl.super__Vector_impl_data._M_start;
                  iVar2 = local_228.w;
                  pAVar11 = local_228.allocator;
                  iVar17 = local_228.elempack;
                  lVar18 = (long)local_228.w;
                  sVar7 = CONCAT44(local_228.elemsize._4_4_,(undefined4)local_228.elemsize);
                  plVar21 = (long *)((long)local_228.data + local_380 * lVar18 * sVar7);
                  piVar24 = (local_48.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                             _M_impl.super__Vector_impl_data._M_start)->refcount;
                  if (piVar24 != (int *)0x0) {
                    LOCK();
                    *piVar24 = *piVar24 + -1;
                    UNLOCK();
                    if (*piVar24 == 0) {
                      if ((local_48.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                           _M_impl.super__Vector_impl_data._M_start)->allocator == (Allocator *)0x0)
                      {
                        if ((local_48.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                             _M_impl.super__Vector_impl_data._M_start)->data != (void *)0x0) {
                          free((local_48.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                _M_impl.super__Vector_impl_data._M_start)->data);
                        }
                      }
                      else {
                        (*(local_48.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                           _M_impl.super__Vector_impl_data._M_start)->allocator->_vptr_Allocator[3])
                                  ();
                      }
                    }
                  }
                  uVar5 = local_268._0_8_;
                  this = local_2c8;
                  pMVar19->data = plVar21;
                  pMVar19->refcount = (int *)0x0;
                  pMVar19->elemsize = sVar7;
                  pMVar19->elempack = iVar17;
                  pMVar19->allocator = pAVar11;
                  pMVar19->dims = 2;
                  pMVar19->w = iVar2;
                  pMVar19->h = iVar16;
                  pMVar19->d = 1;
                  pMVar19->c = 1;
                  pMVar19->cstep = lVar18 * lVar23;
                  local_88.lightmode = local_268.lightmode;
                  local_88.use_shader_pack8 = local_268.use_shader_pack8;
                  local_88.use_subgroup_ops = local_268.use_subgroup_ops;
                  local_88.use_reserved_0 = local_268.use_reserved_0;
                  local_88.blob_allocator._0_4_ = local_268.blob_allocator._0_4_;
                  local_88.blob_allocator._4_4_ = local_268.blob_allocator._4_4_;
                  local_88.flush_denormals = local_268.flush_denormals;
                  local_88.use_local_pool_allocator = local_268.use_local_pool_allocator;
                  local_88.use_shader_local_memory = local_268.use_shader_local_memory;
                  local_88.use_cooperative_matrix = local_268.use_cooperative_matrix;
                  local_88.use_winograd23_convolution = local_268.use_winograd23_convolution;
                  local_88.use_winograd43_convolution = local_268.use_winograd43_convolution;
                  local_88.use_winograd63_convolution = local_268.use_winograd63_convolution;
                  local_88.use_a53_a55_optimized_kernel = local_268.use_a53_a55_optimized_kernel;
                  local_88.use_fp16_uniform = local_268.use_fp16_uniform;
                  local_88.use_int8_uniform = local_268.use_int8_uniform;
                  local_88.use_reserved_9 = local_268.use_reserved_9;
                  local_88.use_reserved_10 = local_268.use_reserved_10;
                  local_88.use_reserved_11 = local_268.use_reserved_11;
                  local_88.use_bf16_storage = local_268.use_bf16_storage;
                  local_88.use_fp16_packed = local_268.use_fp16_packed;
                  local_88.use_fp16_storage = local_268.use_fp16_storage;
                  local_88.use_fp16_arithmetic = local_268.use_fp16_arithmetic;
                  local_88.use_int8_packed = local_268.use_int8_packed;
                  local_88.use_int8_storage = local_268.use_int8_storage;
                  local_88.use_int8_arithmetic = local_268.use_int8_arithmetic;
                  local_88.use_packing_layout = local_268.use_packing_layout;
                  local_88.vulkan_device_index = local_268.vulkan_device_index;
                  local_88.use_reserved_1 = local_268.use_reserved_1;
                  local_88.use_image_storage = local_268.use_image_storage;
                  local_88.use_tensor_storage = local_268.use_tensor_storage;
                  local_88.use_reserved_2 = local_268.use_reserved_2;
                  local_88.workspace_allocator._0_4_ = local_268.workspace_allocator._0_4_;
                  local_88.workspace_allocator._4_4_ = local_268.workspace_allocator._4_4_;
                  local_88.openmp_blocktime = local_268.openmp_blocktime;
                  local_88.use_winograd_convolution = local_268.use_winograd_convolution;
                  local_88.use_sgemm_convolution = local_268.use_sgemm_convolution;
                  local_88.use_int8_inference = local_268.use_int8_inference;
                  local_88.use_vulkan_compute = local_268.use_vulkan_compute;
                  local_88.num_threads = 1;
                  local_268._0_8_ = uVar5;
                  iVar17 = (*local_2c8->qkv_gemm->_vptr_Layer[6])
                                     (local_2c8->qkv_gemm,&local_a0,&local_48,&local_88);
                  piVar24 = local_2c0;
                  local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[(long)local_2c0] = iVar17;
                  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector(&local_48);
                  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector(&local_a0);
                  piVar24 = (int *)((long)piVar24 + 1);
                  iVar2 = (this->super_MultiHeadAttention).num_heads;
                  local_380 = local_380 + lVar23;
                  lVar18 = local_320 + _w;
                } while ((long)piVar24 < (long)iVar2);
                if (0 < iVar2) {
                  lVar18 = 0;
                  do {
                    iVar17 = local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start[lVar18];
                    if (iVar17 != 0) goto LAB_0051d3a5;
                    lVar18 = lVar18 + 1;
                  } while (iVar2 != lVar18);
                }
              }
              piVar24 = (int *)CONCAT44(local_368.refcount._4_4_,local_368.refcount._0_4_);
              if (piVar24 != (int *)0x0) {
                LOCK();
                *piVar24 = *piVar24 + -1;
                UNLOCK();
                if (*piVar24 == 0) {
                  if (local_368.allocator == (Allocator *)0x0) {
                    if (local_368.data != (void *)0x0) {
                      free(local_368.data);
                    }
                  }
                  else {
                    (*(local_368.allocator)->_vptr_Allocator[3])();
                  }
                }
              }
              local_368.cstep = 0;
              local_368.data = (void *)0x0;
              local_368.refcount._0_4_ = 0;
              local_368.refcount._4_4_ = 0;
              local_368.elemsize._0_4_ = 0;
              local_368.elemsize._4_4_ = 0;
              local_368.elempack = 0;
              local_368.dims = 0;
              local_368.w = 0;
              local_368.h = 0;
              local_368.d = 0;
              local_368.c = 0;
              iVar17 = (*this->o_gemm->_vptr_Layer[7])
                                 (this->o_gemm,&local_228,
                                  (local_148->
                                  super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                                  .super__Vector_impl_data._M_start,&local_268);
              if (local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
LAB_0051d3a5:
                operator_delete(local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start,
                                (long)local_1d8.super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_1d8.super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_start);
              }
            }
            piVar24 = (int *)CONCAT44(local_228.refcount._4_4_,local_228.refcount._0_4_);
            if (piVar24 != (int *)0x0) {
              LOCK();
              *piVar24 = *piVar24 + -1;
              UNLOCK();
              if (*piVar24 == 0) {
                if (local_228.allocator == (Allocator *)0x0) {
                  if ((long *)local_228.data != (long *)0x0) {
                    free(local_228.data);
                  }
                }
                else {
                  (*(local_228.allocator)->_vptr_Allocator[3])();
                }
              }
            }
          }
          piVar24 = (int *)CONCAT44(local_368.refcount._4_4_,local_368.refcount._0_4_);
          if (piVar24 != (int *)0x0) {
            LOCK();
            *piVar24 = *piVar24 + -1;
            UNLOCK();
            if (*piVar24 == 0) {
              if (local_368.allocator == (Allocator *)0x0) {
                if (local_368.data != (void *)0x0) {
                  free(local_368.data);
                }
              }
              else {
                (*(local_368.allocator)->_vptr_Allocator[3])();
              }
            }
          }
        }
        if (local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != (pointer)0x0) {
LAB_0051ce20:
          operator_delete(local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
      }
      piVar24 = (int *)CONCAT44(local_198.refcount._4_4_,local_198.refcount._0_4_);
      if (piVar24 != (int *)0x0) {
        LOCK();
        *piVar24 = *piVar24 + -1;
        UNLOCK();
        if (*piVar24 == 0) {
          if (local_198.allocator == (Allocator *)0x0) {
            if (local_198.data != (void *)0x0) {
              free(local_198.data);
            }
          }
          else {
            (*(local_198.allocator)->_vptr_Allocator[3])();
          }
        }
      }
    }
    piVar24 = (int *)CONCAT44(uStack_12c,uStack_130);
    if (piVar24 != (int *)0x0) {
      LOCK();
      *piVar24 = *piVar24 + -1;
      UNLOCK();
      if (*piVar24 == 0) {
        if (local_118 == (long *)0x0) {
          if (local_138 != (void *)0x0) {
            free(local_138);
          }
        }
        else {
          (**(code **)(*local_118 + 0x18))();
        }
      }
    }
  }
  piVar24 = (int *)CONCAT44(uStack_dc,uStack_e0);
  if (piVar24 != (int *)0x0) {
    LOCK();
    *piVar24 = *piVar24 + -1;
    UNLOCK();
    if (*piVar24 == 0) {
      if (local_c8 == (long *)0x0) {
        if (local_e8 != (void *)0x0) {
          free(local_e8);
        }
      }
      else {
        (**(code **)(*local_c8 + 0x18))();
      }
    }
  }
LAB_0051ccbc:
  piVar24 = (int *)CONCAT44(local_318.refcount._4_4_,local_318.refcount._0_4_);
  if (piVar24 != (int *)0x0) {
    LOCK();
    *piVar24 = *piVar24 + -1;
    UNLOCK();
    if (*piVar24 == 0) {
      if (local_318.allocator == (Allocator *)0x0) {
        if (local_318.data != (void *)0x0) {
          free(local_318.data);
        }
      }
      else {
        (*(local_318.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  piVar24 = (int *)CONCAT44(local_2b8.refcount._4_4_,local_2b8.refcount._0_4_);
  if (piVar24 != (int *)0x0) {
    LOCK();
    *piVar24 = *piVar24 + -1;
    UNLOCK();
    if (*piVar24 == 0) {
      if (local_2b8.allocator == (Allocator *)0x0) {
        if (local_2b8.data != (void *)0x0) {
          free(local_2b8.data);
        }
      }
      else {
        (*(local_2b8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar17;
}

Assistant:

int MultiHeadAttention_x86::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& _opt) const
{
    const Mat& q_blob = bottom_blobs[0];
    const Mat& k_blob = (bottom_blobs.size() == 1 || (bottom_blobs.size() == 2 && attn_mask)) ? q_blob : bottom_blobs[1];
    const Mat& v_blob = (bottom_blobs.size() == 1 || (bottom_blobs.size() == 2 && attn_mask)) ? q_blob : (bottom_blobs.size() == 2 || (bottom_blobs.size() == 3 && attn_mask)) ? k_blob : bottom_blobs[2];
    const Mat& attn_mask_blob = attn_mask ? bottom_blobs[bottom_blobs.size() - 1] : Mat();

    Option opt = _opt;
    if (int8_scale_term)
    {
        opt.use_packing_layout = false; // TODO enable packing
    }

    Mat attn_mask_blob_unpacked;
    if (attn_mask && attn_mask_blob.elempack != 1)
    {
        convert_packing(attn_mask_blob, attn_mask_blob_unpacked, 1, opt);
        if (attn_mask_blob_unpacked.empty())
            return -100;
    }
    else
    {
        attn_mask_blob_unpacked = attn_mask_blob;
    }

    const int embed_dim_per_head = embed_dim / num_heads;
    const int src_seqlen = q_blob.h * q_blob.elempack;
    const int dst_seqlen = k_blob.h * k_blob.elempack;

    Mat q_affine;
    int retq = q_gemm->forward(q_blob, q_affine, opt);
    if (retq != 0)
        return retq;

    Mat k_affine;
    int retk = k_gemm->forward(k_blob, k_affine, opt);
    if (retk != 0)
        return retk;

    Mat qk_cross(dst_seqlen, src_seqlen * num_heads, 4u, opt.blob_allocator);
    if (qk_cross.empty())
        return -100;

    std::vector<int> retqks;
    retqks.resize(num_heads);
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int i = 0; i < num_heads; i++)
    {
        std::vector<Mat> qk_bottom_blobs(2);
        qk_bottom_blobs[0] = q_affine.row_range(i * embed_dim_per_head, embed_dim_per_head);
        qk_bottom_blobs[1] = k_affine.row_range(i * embed_dim_per_head, embed_dim_per_head);
        if (attn_mask)
        {
            const Mat& maskm = attn_mask_blob_unpacked.dims == 3 ? attn_mask_blob_unpacked.channel(i) : attn_mask_blob_unpacked;
            qk_bottom_blobs.push_back(maskm);
        }
        std::vector<Mat> qk_top_blobs(1);
        qk_top_blobs[0] = qk_cross.row_range(i * src_seqlen, src_seqlen);
        Option opt1 = opt;
        opt1.num_threads = 1;
        retqks[i] = qk_gemm->forward(qk_bottom_blobs, qk_top_blobs, opt1);
    }
    for (int i = 0; i < num_heads; i++)
    {
        if (retqks[i] != 0)
            return retqks[i];
    }

    q_affine.release();
    k_affine.release();

    int retqk = qk_softmax->forward_inplace(qk_cross, opt);
    if (retqk != 0)
        return retqk;

    Mat v_affine;
    int retv = v_gemm->forward(v_blob, v_affine, opt);
    if (retv != 0)
        return retv;

    Mat qkv_cross(src_seqlen, embed_dim_per_head * num_heads, 4u, opt.blob_allocator);
    if (qkv_cross.empty())
        return -100;

    std::vector<int> retqkvs;
    retqkvs.resize(num_heads);
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int i = 0; i < num_heads; i++)
    {
        std::vector<Mat> qkv_bottom_blobs(2);
        qkv_bottom_blobs[0] = qk_cross.row_range(i * src_seqlen, src_seqlen);
        qkv_bottom_blobs[1] = v_affine.row_range(i * embed_dim_per_head, embed_dim_per_head);
        std::vector<Mat> qkv_top_blobs(1);
        qkv_top_blobs[0] = qkv_cross.row_range(i * embed_dim_per_head, embed_dim_per_head);
        Option opt1 = opt;
        opt1.num_threads = 1;
        retqkvs[i] = qkv_gemm->forward(qkv_bottom_blobs, qkv_top_blobs, opt1);
    }
    for (int i = 0; i < num_heads; i++)
    {
        if (retqkvs[i] != 0)
            return retqkvs[i];
    }

    v_affine.release();

    int reto = o_gemm->forward(qkv_cross, top_blobs[0], opt);
    if (reto != 0)
        return reto;

    return 0;
}